

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::ReporterRegistry::registerReporter
          (ReporterRegistry *this,string *name,Ptr<Catch::IReporterFactory> *factory)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>
  local_38;
  
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>,_true>
            (&local_38,name,factory);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::Ptr<Catch::IReporterFactory>>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::Ptr<Catch::IReporterFactory>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::Ptr<Catch::IReporterFactory>>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Catch::Ptr<Catch::IReporterFactory>>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::Ptr<Catch::IReporterFactory>>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::Ptr<Catch::IReporterFactory>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::Ptr<Catch::IReporterFactory>>>>
              *)&this->m_factories,&local_38);
  if (local_38.second.m_p != (IReporterFactory *)0x0) {
    (*((local_38.second.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.first._M_dataplus._M_p != &local_38.first.field_2) {
    operator_delete(local_38.first._M_dataplus._M_p);
  }
  return;
}

Assistant:

void registerReporter( std::string const& name, Ptr<IReporterFactory> const& factory ) {
            m_factories.insert( std::make_pair( name, factory ) );
        }